

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpVector * __thiscall Basis::recomputex(Basis *this,Instance *inst)

{
  int iVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  const_reference pvVar4;
  reference pvVar5;
  pointer in_RDX;
  HVector *in_RSI;
  QpVector *in_RDI;
  HVector rhs_hvec;
  HighsInt con;
  HighsInt i;
  QpVector rhs;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  HighsTimerClock *in_stack_fffffffffffffe88;
  value_type in_stack_fffffffffffffe90;
  HVector *in_stack_fffffffffffffe98;
  HFactor *in_stack_fffffffffffffea0;
  QpVector *in_stack_fffffffffffffea8;
  Basis *in_stack_fffffffffffffeb0;
  HVectorBase<double> *in_stack_fffffffffffffeb8;
  HVectorBase<double> *in_stack_fffffffffffffec0;
  Basis *in_stack_fffffffffffffee8;
  int local_54;
  vector<int,_std::allocator<int>_> vStack_48;
  pointer local_18;
  
  local_18 = in_RDX;
  QpVector::QpVector((QpVector *)in_stack_fffffffffffffeb0,
                     (HighsInt)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  for (local_54 = 0; local_54 < local_18[1]; local_54 = local_54 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RSI[0xd].index,(long)local_54);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RSI[0xd].packIndex,(long)iVar1);
    if (*pvVar2 == -1) {
      printf("error\n");
    }
    pmVar3 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[]((map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                           *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->size);
    if (*pmVar3 == kActiveAtLower) {
      if (iVar1 < local_18[2]) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x3e),(long)iVar1
                           );
        in_stack_fffffffffffffec0 = (HVectorBase<double> *)*pvVar4;
        in_stack_fffffffffffffeb8 = (HVectorBase<double> *)&stack0xffffffffffffffd0;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI[0xd].packIndex,(long)iVar1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb8,
                            (long)*pvVar2);
        *pvVar5 = (value_type)in_stack_fffffffffffffec0;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x74),
                            (long)(iVar1 - local_18[2]));
        in_stack_fffffffffffffeb0 = (Basis *)*pvVar4;
        in_stack_fffffffffffffea8 = (QpVector *)&stack0xffffffffffffffd0;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI[0xd].packIndex,(long)iVar1);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea8,
                            (long)*pvVar2);
        *pvVar5 = (value_type)in_stack_fffffffffffffeb0;
      }
    }
    else if (iVar1 < local_18[2]) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x44),(long)iVar1);
      in_stack_fffffffffffffea0 = (HFactor *)*pvVar4;
      in_stack_fffffffffffffe98 = (HVector *)&stack0xffffffffffffffd0;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RSI[0xd].packIndex,(long)iVar1);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe98,
                          (long)*pvVar2);
      *pvVar5 = (value_type)in_stack_fffffffffffffea0;
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x7a),
                          (long)(iVar1 - local_18[2]));
      in_stack_fffffffffffffe90 = *pvVar4;
      in_stack_fffffffffffffe88 = (HighsTimerClock *)&stack0xffffffffffffffd0;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RSI[0xd].packIndex,(long)iVar1);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88,
                          (long)*pvVar2);
      *pvVar5 = in_stack_fffffffffffffe90;
    }
    in_stack_fffffffffffffe84 = local_54;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_48,(long)local_54);
    *pvVar2 = in_stack_fffffffffffffe84;
  }
  vec2hvec(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  HFactor::btranCall(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  hvec2vec(in_stack_fffffffffffffee8,in_RSI);
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  QpVector::~QpVector((QpVector *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return in_RDI;
}

Assistant:

QpVector Basis::recomputex(const Instance& inst) {
  assert((HighsInt)active_constraint_index.size() == inst.num_var);
  QpVector rhs(inst.num_var);

  for (HighsInt i = 0; i < inst.num_var; i++) {
    HighsInt con = active_constraint_index[i];
    if (constraintindexinbasisfactor[con] == -1) {
      printf("error\n");
    }
    if (basisstatus[con] == BasisStatus::kActiveAtLower) {
      if (con < inst.num_con) {
        rhs.value[constraintindexinbasisfactor[con]] = inst.con_lo[con];
      } else {
        rhs.value[constraintindexinbasisfactor[con]] =
            inst.var_lo[con - inst.num_con];
      }
    } else {
      if (con < inst.num_con) {
        rhs.value[constraintindexinbasisfactor[con]] = inst.con_up[con];
        // rhs.value[i] = inst.con_up[con];
      } else {
        rhs.value[constraintindexinbasisfactor[con]] =
            inst.var_up[con - inst.num_con];
        // rhs.value[i] = inst.var_up[con - inst.num_con];
      }
    }

    rhs.index[i] = i;
    rhs.num_nz++;
  }
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.btranCall(rhs_hvec, 1.0);
  return hvec2vec(rhs_hvec);
}